

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int codeEqualityTerm(Parse *pParse,WhereTerm *pTerm,WhereLevel *pLevel,int iEq,int bRev,int iTarget)

{
  byte *pbVar1;
  u8 uVar2;
  int p1;
  Vdbe *p;
  WhereLoop *pWVar3;
  Index *pIVar4;
  sqlite3 *db;
  ExprList *pEVar5;
  ExprList *pList;
  Expr *pExpr;
  int iVar6;
  int iVar7;
  int iVar8;
  Expr *pX;
  InLoop *pIVar9;
  long lVar10;
  anon_union_4_2_6146edf4_for_u *paVar11;
  long lVar12;
  Expr *pEVar13;
  int op;
  ulong uVar14;
  int p3;
  int iVar15;
  long lVar16;
  uint uVar17;
  bool bVar18;
  bool bVar19;
  uint local_a4;
  ExprList *local_a0;
  ExprList *local_90;
  byte local_60;
  
  pEVar13 = pTerm->pExpr;
  uVar2 = pEVar13->op;
  if (uVar2 != '5') {
    p = pParse->pVdbe;
    if (uVar2 == '2') {
      sqlite3VdbeAddOp3(p,0x49,0,iTarget,0);
      goto LAB_001846fc;
    }
    if (uVar2 != '-') {
      pWVar3 = pLevel->pWLoop;
      local_a4 = bRev;
      if ((((pWVar3->wsFlags & 0x400) == 0) &&
          (pIVar4 = (pWVar3->u).btree.pIndex, pIVar4 != (Index *)0x0)) &&
         (pIVar4->aSortOrder[iEq] != '\0')) {
        local_a4 = (uint)(bRev == 0);
      }
      bVar18 = 0 < iEq;
      if (0 < iEq) {
        uVar14 = 1;
        do {
          if ((pWVar3->aLTerm[uVar14 - 1] != (WhereTerm *)0x0) &&
             (pWVar3->aLTerm[uVar14 - 1]->pExpr == pEVar13)) {
            disableTerm(pLevel,pTerm);
            goto LAB_001846f5;
          }
          bVar18 = uVar14 < (uint)iEq;
          bVar19 = uVar14 != (uint)iEq;
          uVar14 = uVar14 + 1;
        } while (bVar19);
      }
      iVar15 = 0;
      if (iEq < (int)(uint)pWVar3->nLTerm) {
        uVar14 = (ulong)iEq;
        iVar15 = 0;
        do {
          iVar15 = iVar15 + (uint)(pWVar3->aLTerm[uVar14]->pExpr == pEVar13);
          uVar14 = uVar14 + 1;
        } while (pWVar3->nLTerm != uVar14);
      }
      if (((pEVar13->flags & 0x800) == 0) || (((pEVar13->x).pSelect)->pEList->nExpr == 1)) {
        local_a0 = (ExprList *)0x0;
        iVar6 = sqlite3FindInIndex(pParse,pEVar13,4,(int *)0x0,(int *)0x0);
      }
      else {
        db = pParse->db;
        pX = exprDup(db,pEVar13,0,(u8 **)0x0);
        if (db->mallocFailed == '\0') {
          pEVar5 = ((pX->x).pSelect)->pEList;
          pList = (pX->pLeft->x).pList;
          if (iEq < (int)(uint)pWVar3->nLTerm) {
            lVar12 = (long)iEq;
            local_90 = (ExprList *)0x0;
            local_a0 = (ExprList *)0x0;
            do {
              if (pWVar3->aLTerm[lVar12]->pExpr == pEVar13) {
                lVar16 = (long)pWVar3->aLTerm[lVar12]->iField;
                pExpr = pEVar5->a[lVar16 + -1].pExpr;
                if (pExpr != (Expr *)0x0) {
                  local_90 = sqlite3ExprListAppend(pParse,local_90,pExpr);
                  pEVar5->a[lVar16 + -1].pExpr = (Expr *)0x0;
                  local_a0 = sqlite3ExprListAppend(pParse,local_a0,pList->a[lVar16 + -1].pExpr);
                  pList->a[lVar16 + -1].pExpr = (Expr *)0x0;
                }
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < (long)(ulong)pWVar3->nLTerm);
          }
          else {
            local_a0 = (ExprList *)0x0;
            local_90 = (ExprList *)0x0;
          }
          if (pEVar5 != (ExprList *)0x0) {
            exprListDeleteNN(db,pEVar5);
          }
          if (pList != (ExprList *)0x0) {
            exprListDeleteNN(db,pList);
          }
          (pX->pLeft->x).pList = local_a0;
          ((pX->x).pSelect)->pEList = local_90;
          if ((local_a0 != (ExprList *)0x0) && (local_a0->nExpr == 1)) {
            pEVar13 = local_a0->a[0].pExpr;
            local_a0->a[0].pExpr = (Expr *)0x0;
            if (pX->pLeft != (Expr *)0x0) {
              sqlite3ExprDeleteNN(db,pX->pLeft);
            }
            pX->pLeft = pEVar13;
          }
          pEVar5 = ((pX->x).pSelect)->pOrderBy;
          if ((pEVar5 != (ExprList *)0x0) && (0 < pEVar5->nExpr)) {
            paVar11 = &pEVar5->a[0].u;
            lVar12 = 0;
            do {
              (paVar11->x).iOrderByCol = 0;
              lVar12 = lVar12 + 1;
              paVar11 = paVar11 + 8;
            } while (lVar12 < pEVar5->nExpr);
          }
        }
        if (db->mallocFailed == '\0') {
          local_a0 = (ExprList *)sqlite3DbMallocZero(pParse->db,(long)iVar15 * 4);
          iVar6 = sqlite3FindInIndex(pParse,pX,4,(int *)0x0,(int *)local_a0);
          pTerm->pExpr->iTable = pX->iTable;
        }
        else {
          iVar6 = 5;
          local_a0 = (ExprList *)0x0;
        }
        if (pX != (Expr *)0x0) {
          sqlite3ExprDeleteNN(db,pX);
        }
        pEVar13 = pTerm->pExpr;
      }
      uVar17 = (uint)(local_a4 == 0);
      if (iVar6 != 4) {
        uVar17 = local_a4;
      }
      p1 = pEVar13->iTable;
      sqlite3VdbeAddOp3(p,(uint)(uVar17 == 0) * 4 + 0x20,p1,0,0);
      pbVar1 = (byte *)((long)&pWVar3->wsFlags + 1);
      *pbVar1 = *pbVar1 | 8;
      if ((pLevel->u).in.nIn == 0) {
        iVar7 = sqlite3VdbeMakeLabel(p);
        pLevel->addrNxt = iVar7;
      }
      lVar16 = (long)(pLevel->u).in.nIn;
      lVar12 = iVar15 + lVar16;
      (pLevel->u).in.nIn = (int)lVar12;
      pIVar9 = (InLoop *)sqlite3DbReallocOrFree(pParse->db,(pLevel->u).in.aInLoop,lVar12 * 0x14);
      (pLevel->u).in.aInLoop = pIVar9;
      if (pIVar9 == (InLoop *)0x0) {
        (pLevel->u).in.nIn = 0;
      }
      else if (iEq < (int)(uint)pWVar3->nLTerm) {
        pIVar9 = pIVar9 + lVar16;
        local_60 = uVar17 == 0 | 4;
        lVar16 = (long)iEq;
        lVar12 = 0;
        iVar15 = 0;
        iVar7 = iTarget;
        do {
          if (pWVar3->aLTerm[lVar16]->pExpr == pEVar13) {
            if (iVar6 == 1) {
              op = 0x81;
              iVar8 = iVar7;
              p3 = 0;
            }
            else {
              if (local_a0 == (ExprList *)0x0) {
                iVar8 = 0;
              }
              else {
                lVar10 = (long)iVar15;
                iVar15 = iVar15 + 1;
                iVar8 = *(int *)((long)local_a0 + lVar10 * 4);
              }
              op = 0x5a;
              p3 = iVar7;
            }
            iVar8 = sqlite3VdbeAddOp3(p,op,p1,iVar8,p3);
            pIVar9->addrInTop = iVar8;
            sqlite3VdbeAddOp3(p,0x32,iVar7,0,0);
            if (lVar12 == 0) {
              pIVar9->iCur = p1;
              pIVar9->eEndLoopOp = local_60;
              if ((iEq < 1) || (uVar17 = pWVar3->wsFlags, (uVar17 >> 10 & 1) != 0)) {
                pIVar9->nPrefix = 0;
              }
              else {
                pIVar9->iBase = iTarget - iEq;
                pIVar9->nPrefix = (int)lVar16;
                pWVar3->wsFlags = uVar17 | 0x40000;
              }
            }
            else {
              pIVar9->eEndLoopOp = 0xab;
            }
            pIVar9 = pIVar9 + 1;
          }
          lVar16 = lVar16 + 1;
          lVar12 = lVar12 + -1;
          iVar7 = iVar7 + 1;
        } while (lVar16 < (long)(ulong)pWVar3->nLTerm);
      }
      if (local_a0 != (ExprList *)0x0) {
        sqlite3DbFreeNN(pParse->db,local_a0);
      }
LAB_001846f5:
      if (bVar18) {
        return iTarget;
      }
      goto LAB_001846fc;
    }
  }
  iTarget = sqlite3ExprCodeTarget(pParse,pEVar13->pRight,iTarget);
LAB_001846fc:
  disableTerm(pLevel,pTerm);
  return iTarget;
}

Assistant:

static int codeEqualityTerm(
  Parse *pParse,      /* The parsing context */
  WhereTerm *pTerm,   /* The term of the WHERE clause to be coded */
  WhereLevel *pLevel, /* The level of the FROM clause we are working on */
  int iEq,            /* Index of the equality term within this level */
  int bRev,           /* True for reverse-order IN operations */
  int iTarget         /* Attempt to leave results in this register */
){
  Expr *pX = pTerm->pExpr;
  Vdbe *v = pParse->pVdbe;
  int iReg;                  /* Register holding results */

  assert( pLevel->pWLoop->aLTerm[iEq]==pTerm );
  assert( iTarget>0 );
  if( pX->op==TK_EQ || pX->op==TK_IS ){
    iReg = sqlite3ExprCodeTarget(pParse, pX->pRight, iTarget);
  }else if( pX->op==TK_ISNULL ){
    iReg = iTarget;
    sqlite3VdbeAddOp2(v, OP_Null, 0, iReg);
#ifndef SQLITE_OMIT_SUBQUERY
  }else{
    int eType = IN_INDEX_NOOP;
    int iTab;
    struct InLoop *pIn;
    WhereLoop *pLoop = pLevel->pWLoop;
    int i;
    int nEq = 0;
    int *aiMap = 0;

    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
      && pLoop->u.btree.pIndex!=0
      && pLoop->u.btree.pIndex->aSortOrder[iEq]
    ){
      testcase( iEq==0 );
      testcase( bRev );
      bRev = !bRev;
    }
    assert( pX->op==TK_IN );
    iReg = iTarget;

    for(i=0; i<iEq; i++){
      if( pLoop->aLTerm[i] && pLoop->aLTerm[i]->pExpr==pX ){
        disableTerm(pLevel, pTerm);
        return iTarget;
      }
    }
    for(i=iEq;i<pLoop->nLTerm; i++){
      assert( pLoop->aLTerm[i]!=0 );
      if( pLoop->aLTerm[i]->pExpr==pX ) nEq++;
    }

    if( (pX->flags & EP_xIsSelect)==0 || pX->x.pSelect->pEList->nExpr==1 ){
      eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, 0);
    }else{
      sqlite3 *db = pParse->db;
      pX = removeUnindexableInClauseTerms(pParse, iEq, pLoop, pX);

      if( !db->mallocFailed ){
        aiMap = (int*)sqlite3DbMallocZero(pParse->db, sizeof(int)*nEq);
        eType = sqlite3FindInIndex(pParse, pX, IN_INDEX_LOOP, 0, aiMap);
        pTerm->pExpr->iTable = pX->iTable;
      }
      sqlite3ExprDelete(db, pX);
      pX = pTerm->pExpr;
    }

    if( eType==IN_INDEX_INDEX_DESC ){
      testcase( bRev );
      bRev = !bRev;
    }
    iTab = pX->iTable;
    sqlite3VdbeAddOp2(v, bRev ? OP_Last : OP_Rewind, iTab, 0);
    VdbeCoverageIf(v, bRev);
    VdbeCoverageIf(v, !bRev);
    assert( (pLoop->wsFlags & WHERE_MULTI_OR)==0 );

    pLoop->wsFlags |= WHERE_IN_ABLE;
    if( pLevel->u.in.nIn==0 ){
      pLevel->addrNxt = sqlite3VdbeMakeLabel(v);
    }

    i = pLevel->u.in.nIn;
    pLevel->u.in.nIn += nEq;
    pLevel->u.in.aInLoop =
       sqlite3DbReallocOrFree(pParse->db, pLevel->u.in.aInLoop,
                              sizeof(pLevel->u.in.aInLoop[0])*pLevel->u.in.nIn);
    pIn = pLevel->u.in.aInLoop;
    if( pIn ){
      int iMap = 0;               /* Index in aiMap[] */
      pIn += i;
      for(i=iEq;i<pLoop->nLTerm; i++){
        if( pLoop->aLTerm[i]->pExpr==pX ){
          int iOut = iReg + i - iEq;
          if( eType==IN_INDEX_ROWID ){
            testcase( nEq>1 );  /* Happens with a UNIQUE index on ROWID */
            pIn->addrInTop = sqlite3VdbeAddOp2(v, OP_Rowid, iTab, iOut);
          }else{
            int iCol = aiMap ? aiMap[iMap++] : 0;
            pIn->addrInTop = sqlite3VdbeAddOp3(v,OP_Column,iTab, iCol, iOut);
          }
          sqlite3VdbeAddOp1(v, OP_IsNull, iOut); VdbeCoverage(v);
          if( i==iEq ){
            pIn->iCur = iTab;
            pIn->eEndLoopOp = bRev ? OP_Prev : OP_Next;
            if( iEq>0 && (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0 ){
              pIn->iBase = iReg - i;
              pIn->nPrefix = i;
              pLoop->wsFlags |= WHERE_IN_EARLYOUT;
            }else{
              pIn->nPrefix = 0;
            }
          }else{
            pIn->eEndLoopOp = OP_Noop;
          }
          pIn++;
        }
      }
    }else{
      pLevel->u.in.nIn = 0;
    }
    sqlite3DbFree(pParse->db, aiMap);
#endif
  }
  disableTerm(pLevel, pTerm);
  return iReg;
}